

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O2

void __thiscall
btGjkPairDetector::getClosestPointsNonVirtual
          (btGjkPairDetector *this,ClosestPointInput *input,Result *output,btIDebugDraw *debugDraw)

{
  btVector3 *v;
  btConvexPenetrationDepthSolver *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  btScalar bVar6;
  bool bVar7;
  int iVar8;
  btTransform *m;
  bool bVar9;
  float fVar10;
  btScalar bVar11;
  btScalar bVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btVector3 bVar17;
  btVector3 bVar18;
  btVector3 bVar19;
  btVector3 bVar20;
  float local_238;
  btVector3 seperatingAxisInB;
  btVector3 pInA;
  btVector3 seperatingAxisInA;
  btScalar marginB;
  btScalar marginA;
  btVector3 local_1d8;
  btVector3 qInB;
  btVector3 pWorld;
  btVector3 qWorld;
  btVector3 newCachedSeparatingAxis;
  float local_188;
  float local_168;
  float fStack_164;
  float local_158;
  btVector3 w;
  float local_128;
  btTransform local_108;
  btTransform local_c8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  btVector3 qInB_1;
  
  this->m_cachedSeparatingDistance = 0.0;
  local_1d8.m_floats[0] = 0.0;
  local_1d8.m_floats[1] = 0.0;
  local_1d8.m_floats[2] = 0.0;
  local_1d8.m_floats[3] = 0.0;
  local_c8.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
  local_c8.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((input->m_transformA).m_basis.m_el[0].m_floats + 2);
  local_c8.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
  local_c8.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((input->m_transformA).m_basis.m_el[1].m_floats + 2);
  local_c8.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
  local_c8.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((input->m_transformA).m_basis.m_el[2].m_floats + 2);
  uVar2 = *(undefined8 *)(input->m_transformA).m_origin.m_floats;
  uVar3 = *(undefined8 *)((input->m_transformA).m_origin.m_floats + 2);
  local_108.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
  local_108.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((input->m_transformB).m_basis.m_el[0].m_floats + 2);
  local_108.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
  local_108.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((input->m_transformB).m_basis.m_el[1].m_floats + 2);
  local_108.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
  local_108.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((input->m_transformB).m_basis.m_el[2].m_floats + 2);
  uVar4 = *(undefined8 *)(input->m_transformB).m_origin.m_floats;
  uVar5 = *(undefined8 *)((input->m_transformB).m_origin.m_floats + 2);
  local_c8.m_origin.m_floats[2] = (btScalar)uVar3;
  local_108.m_origin.m_floats[2] = (btScalar)uVar5;
  fVar10 = (float)uVar2;
  fVar13 = (float)((ulong)uVar2 >> 0x20);
  fVar14 = (float)uVar4;
  fVar15 = (float)((ulong)uVar4 >> 0x20);
  local_58 = (fVar10 + fVar14) * 0.5;
  fStack_54 = (fVar13 + fVar15) * 0.5;
  uStack_50 = 0;
  uStack_4c = 0;
  fVar16 = (local_c8.m_origin.m_floats[2] + local_108.m_origin.m_floats[2]) * 0.5;
  local_c8.m_origin.m_floats[1] = fVar13 - fStack_54;
  local_c8.m_origin.m_floats[0] = fVar10 - local_58;
  local_c8.m_origin.m_floats[3] = (btScalar)((ulong)uVar3 >> 0x20);
  local_c8.m_origin.m_floats[2] = local_c8.m_origin.m_floats[2] - fVar16;
  local_108.m_origin.m_floats[1] = fVar15 - fStack_54;
  local_108.m_origin.m_floats[0] = fVar14 - local_58;
  local_68 = ZEXT416((uint)fVar16);
  local_108.m_origin.m_floats[3] = (btScalar)((ulong)uVar5 >> 0x20);
  local_108.m_origin.m_floats[2] = local_108.m_origin.m_floats[2] - fVar16;
  if ((this->m_minkowskiA->super_btCollisionShape).m_shapeType - 0x11U < 2) {
    bVar9 = (this->m_minkowskiB->super_btCollisionShape).m_shapeType - 0x11U < 2;
  }
  else {
    bVar9 = false;
  }
  marginA = this->m_marginA;
  marginB = this->m_marginB;
  gNumGjkChecks = gNumGjkChecks + 1;
  if (this->m_ignoreMargin == true) {
    marginA = 0.0;
    marginB = 0.0;
  }
  bVar6 = marginA;
  bVar12 = marginB;
  m = &input->m_transformB;
  v = &this->m_cachedSeparatingAxis;
  (this->m_cachedSeparatingAxis).m_floats[0] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[1] = 1.0;
  (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
  this->m_degenerateSimplex = 0;
  this->m_lastUsedMethod = -1;
  this->m_curIter = 0;
  fVar10 = marginA + marginB;
  btVoronoiSimplexSolver::reset(this->m_simplexSolver);
  local_238 = 1e+18;
  do {
    seperatingAxisInB = operator-(v);
    seperatingAxisInA = operator*(&seperatingAxisInB,(btMatrix3x3 *)input);
    seperatingAxisInB = operator*(v,&m->m_basis);
    pInA = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                     (this->m_minkowskiA,&seperatingAxisInA);
    qInB = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                     (this->m_minkowskiB,&seperatingAxisInB);
    pWorld = btTransform::operator()(&local_c8,&pInA);
    qWorld = btTransform::operator()(&local_108,&qInB);
    fVar13 = qWorld.m_floats[0];
    fVar14 = qWorld.m_floats[1];
    if (bVar9) {
      pWorld.m_floats[2] = 0.0;
      qWorld.m_floats[2] = 0.0;
      fVar15 = 0.0;
    }
    else {
      fVar15 = pWorld.m_floats[2] - qWorld.m_floats[2];
    }
    fVar13 = pWorld.m_floats[0] - fVar13;
    fVar14 = pWorld.m_floats[1] - fVar14;
    w.m_floats[1] = fVar14;
    w.m_floats[0] = fVar13;
    w.m_floats[2] = fVar15;
    w.m_floats[3] = 0.0;
    fVar13 = fVar15 * (this->m_cachedSeparatingAxis).m_floats[2] +
             fVar13 * (this->m_cachedSeparatingAxis).m_floats[0] +
             fVar14 * (this->m_cachedSeparatingAxis).m_floats[1];
    if ((0.0 < fVar13) && (input->m_maximumDistanceSquared * local_238 < fVar13 * fVar13)) {
      iVar8 = 10;
LAB_00165091:
      this->m_degenerateSimplex = iVar8;
      btVoronoiSimplexSolver::compute_points
                (this->m_simplexSolver,&seperatingAxisInA,&seperatingAxisInB);
      local_1d8.m_floats._0_8_ = *(undefined8 *)v->m_floats;
      local_1d8.m_floats._8_8_ = *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2);
      bVar11 = btVector3::length2(v);
      if (bVar11 < 0.0001) {
        this->m_degenerateSimplex = 5;
      }
      if (bVar11 <= 1.4210855e-14) {
        this->m_lastUsedMethod = 2;
        goto LAB_001650f3;
      }
      if (bVar11 < 0.0) {
        fVar13 = sqrtf(bVar11);
      }
      else {
        fVar13 = SQRT(bVar11);
      }
      fVar13 = 1.0 / fVar13;
      local_1d8.m_floats._0_8_ =
           CONCAT44(fVar13 * local_1d8.m_floats[1],fVar13 * local_1d8.m_floats[0]);
      local_1d8.m_floats[2] = local_1d8.m_floats[2] * fVar13;
      if (local_238 < 0.0) {
        local_238 = sqrtf(local_238);
      }
      else {
        local_238 = SQRT(local_238);
      }
      pInA.m_floats[0] = bVar6 / local_238;
      bVar18 = operator*(v,pInA.m_floats);
      bVar17 = seperatingAxisInA;
      fVar14 = seperatingAxisInA.m_floats[0];
      seperatingAxisInA.m_floats[1] = seperatingAxisInA.m_floats[1] - bVar18.m_floats[1];
      seperatingAxisInA.m_floats[0] = fVar14 - bVar18.m_floats[0];
      seperatingAxisInA.m_floats[2] = bVar17.m_floats[2];
      seperatingAxisInA.m_floats[3] = bVar17.m_floats[3];
      seperatingAxisInA.m_floats[2] = seperatingAxisInA.m_floats[2] - bVar18.m_floats[2];
      pInA.m_floats[0] = bVar12 / local_238;
      bVar18 = operator*(v,pInA.m_floats);
      bVar17 = seperatingAxisInB;
      fVar14 = seperatingAxisInB.m_floats[0];
      seperatingAxisInB.m_floats[1] = seperatingAxisInB.m_floats[1] + bVar18.m_floats[1];
      seperatingAxisInB.m_floats[0] = fVar14 + bVar18.m_floats[0];
      seperatingAxisInB.m_floats[2] = bVar17.m_floats[2];
      seperatingAxisInB.m_floats[3] = bVar17.m_floats[3];
      seperatingAxisInB.m_floats[2] = bVar18.m_floats[2] + seperatingAxisInB.m_floats[2];
      fVar13 = 1.0 / fVar13 - fVar10;
      this->m_lastUsedMethod = 1;
      bVar9 = true;
      goto LAB_001651f4;
    }
    bVar7 = btVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&w);
    if (bVar7) {
      iVar8 = 1;
      goto LAB_00165091;
    }
    if (local_238 - fVar13 <= local_238 * 1e-06) {
      iVar8 = (uint)(0.0 < local_238 - fVar13) * 9 + 2;
      goto LAB_00165091;
    }
    btVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&w,&pWorld,&qWorld);
    bVar7 = btVoronoiSimplexSolver::closest(this->m_simplexSolver,&newCachedSeparatingAxis);
    if (!bVar7) {
      iVar8 = 3;
      goto LAB_00165091;
    }
    bVar11 = btVector3::length2(&newCachedSeparatingAxis);
    if (bVar11 < 1e-06) {
      iVar8 = 6;
      *(undefined8 *)v->m_floats = newCachedSeparatingAxis.m_floats._0_8_;
      *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) =
           newCachedSeparatingAxis.m_floats._8_8_;
      goto LAB_00165091;
    }
    bVar11 = btVector3::length2(&newCachedSeparatingAxis);
    if (local_238 - bVar11 <= local_238 * 1.1920929e-07) {
      iVar8 = 0xc;
      local_238 = bVar11;
      goto LAB_00165091;
    }
    v->m_floats[0] = newCachedSeparatingAxis.m_floats[0];
    (this->m_cachedSeparatingAxis).m_floats[1] = newCachedSeparatingAxis.m_floats[1];
    (this->m_cachedSeparatingAxis).m_floats[2] = newCachedSeparatingAxis.m_floats[2];
    (this->m_cachedSeparatingAxis).m_floats[3] = newCachedSeparatingAxis.m_floats[3];
    iVar8 = this->m_curIter;
    this->m_curIter = iVar8 + 1;
    if (1000 < iVar8) goto LAB_001650f3;
    local_238 = bVar11;
  } while (this->m_simplexSolver->m_numVertices != 4);
  this->m_degenerateSimplex = 0xd;
LAB_001650f3:
  fVar13 = 0.0;
  bVar9 = false;
LAB_001651f4:
  pbVar1 = this->m_penetrationDepthSolver;
  bVar7 = true;
  if (((this->m_catchDegeneracies != 0) && (pbVar1 != (btConvexPenetrationDepthSolver *)0x0)) &&
     (this->m_degenerateSimplex != 0)) {
    bVar7 = 0.01 <= fVar10 + fVar13;
  }
  if (!(bool)(bVar7 & bVar9) && pbVar1 != (btConvexPenetrationDepthSolver *)0x0) {
    gNumDeepPenetrationChecks = gNumDeepPenetrationChecks + 1;
    v->m_floats[0] = 0.0;
    v->m_floats[1] = 0.0;
    (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
    (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
    iVar8 = (*pbVar1->_vptr_btConvexPenetrationDepthSolver[2])
                      (pbVar1,this->m_simplexSolver,this->m_minkowskiA,this->m_minkowskiB,&local_c8,
                       &local_108,v,&pInA,&qInB,debugDraw);
    if ((char)iVar8 == '\0') {
      bVar12 = btVector3::length2(v);
      if (0.0 < bVar12) {
        pWorld.m_floats[1] = pInA.m_floats[1] - qInB.m_floats[1];
        pWorld.m_floats[0] = pInA.m_floats[0] - qInB.m_floats[0];
        pWorld.m_floats[2] = pInA.m_floats[2] - qInB.m_floats[2];
        pWorld.m_floats[3] = 0.0;
        bVar12 = btVector3::length(&pWorld);
        fVar10 = bVar12 - fVar10;
        if ((!bVar9) || (fVar10 < fVar13)) {
          seperatingAxisInA = pInA;
          seperatingAxisInB = qInB;
          bVar18 = operator*(v,&marginA);
          bVar17 = seperatingAxisInA;
          fVar13 = seperatingAxisInA.m_floats[0];
          seperatingAxisInA.m_floats[1] = seperatingAxisInA.m_floats[1] - bVar18.m_floats[1];
          seperatingAxisInA.m_floats[0] = fVar13 - bVar18.m_floats[0];
          seperatingAxisInA.m_floats[2] = bVar17.m_floats[2];
          seperatingAxisInA.m_floats[3] = bVar17.m_floats[3];
          seperatingAxisInA.m_floats[2] = seperatingAxisInA.m_floats[2] - bVar18.m_floats[2];
          bVar18 = operator*(v,&marginB);
          bVar17 = seperatingAxisInB;
          fVar13 = seperatingAxisInB.m_floats[0];
          seperatingAxisInB.m_floats[1] = seperatingAxisInB.m_floats[1] + bVar18.m_floats[1];
          seperatingAxisInB.m_floats[0] = fVar13 + bVar18.m_floats[0];
          seperatingAxisInB.m_floats[2] = bVar17.m_floats[2];
          seperatingAxisInB.m_floats[3] = bVar17.m_floats[3];
          seperatingAxisInB.m_floats[2] = bVar18.m_floats[2] + seperatingAxisInB.m_floats[2];
          local_1d8.m_floats._0_8_ = *(undefined8 *)v->m_floats;
          local_1d8.m_floats._8_8_ = *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2);
          btVector3::normalize(&local_1d8);
          bVar9 = true;
          iVar8 = 6;
        }
        else {
          iVar8 = 5;
          fVar10 = fVar13;
        }
        this->m_lastUsedMethod = iVar8;
        fVar13 = fVar10;
      }
    }
    else {
      pWorld.m_floats[1] = qInB.m_floats[1] - pInA.m_floats[1];
      pWorld.m_floats[0] = qInB.m_floats[0] - pInA.m_floats[0];
      pWorld.m_floats[2] = qInB.m_floats[2] - pInA.m_floats[2];
      pWorld.m_floats[3] = 0.0;
      fVar10 = btVector3::length2(&pWorld);
      if (fVar10 <= 1.4210855e-14) {
        pWorld.m_floats = *&v->m_floats;
        fVar10 = btVector3::length2(v);
      }
      if (1.4210855e-14 < fVar10) {
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        qWorld.m_floats[0] = fVar10;
        btVector3::operator/=(&pWorld,qWorld.m_floats);
        qWorld.m_floats[1] = pInA.m_floats[1] - qInB.m_floats[1];
        qWorld.m_floats[0] = pInA.m_floats[0] - qInB.m_floats[0];
        qWorld.m_floats[2] = pInA.m_floats[2] - qInB.m_floats[2];
        qWorld.m_floats[3] = 0.0;
        bVar12 = btVector3::length(&qWorld);
        bVar17 = pWorld;
        fVar10 = -bVar12;
        this->m_lastUsedMethod = 3;
        if ((!bVar9) || (fVar10 < fVar13)) {
          seperatingAxisInA = pInA;
          seperatingAxisInB = qInB;
          local_1d8.m_floats[0] = pWorld.m_floats[0];
          local_1d8.m_floats[1] = pWorld.m_floats[1];
          local_1d8.m_floats[2] = pWorld.m_floats[2];
          local_1d8.m_floats[3] = pWorld.m_floats[3];
          pWorld = bVar17;
          qWorld = operator*(&local_1d8,(btMatrix3x3 *)input);
          newCachedSeparatingAxis.m_floats[2] = -local_1d8.m_floats[2];
          newCachedSeparatingAxis.m_floats[0] =
               (btScalar)(int)(local_1d8.m_floats._0_8_ ^ 0x8000000080000000);
          newCachedSeparatingAxis.m_floats[1] =
               (btScalar)(int)((local_1d8.m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
          newCachedSeparatingAxis.m_floats[3] = 0.0;
          w = operator*(&newCachedSeparatingAxis,&m->m_basis);
          newCachedSeparatingAxis =
               btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                         (this->m_minkowskiA,&qWorld);
          qInB_1 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                             (this->m_minkowskiB,&w);
          bVar17 = btTransform::operator()(&local_c8,&newCachedSeparatingAxis);
          bVar18 = btTransform::operator()(&local_108,&qInB_1);
          local_78._8_4_ = extraout_XMM0_Dc;
          local_78._0_8_ = bVar18.m_floats._0_8_;
          local_78._12_4_ = extraout_XMM0_Dd;
          fVar15 = local_1d8.m_floats[0];
          fVar16 = local_1d8.m_floats[1];
          fVar14 = -local_1d8.m_floats[2];
          w.m_floats[2] = fVar14;
          w.m_floats[0] = (btScalar)(int)(local_1d8.m_floats._0_8_ ^ 0x8000000080000000);
          w.m_floats[1] = (btScalar)(int)((local_1d8.m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
          w.m_floats[3] = 0.0;
          qWorld = operator*(&w,(btMatrix3x3 *)input);
          w = operator*(&local_1d8,&m->m_basis);
          newCachedSeparatingAxis =
               btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                         (this->m_minkowskiA,&qWorld);
          qInB_1 = btConvexShape::localGetSupportVertexWithoutMarginNonVirtual
                             (this->m_minkowskiB,&w);
          bVar19 = btTransform::operator()(&local_c8,&newCachedSeparatingAxis);
          local_88._8_4_ = extraout_XMM0_Dc_00;
          local_88._0_8_ = bVar19.m_floats._0_8_;
          local_88._12_4_ = extraout_XMM0_Dd_00;
          bVar20 = btTransform::operator()(&local_108,&qInB_1);
          local_168 = bVar17.m_floats[0];
          fStack_164 = bVar17.m_floats[1];
          local_188 = bVar17.m_floats[2];
          local_158 = bVar19.m_floats[2];
          local_128 = bVar18.m_floats[2];
          bVar9 = true;
          fVar13 = fVar10;
          if (local_1d8.m_floats[2] * (local_158 - bVar20.m_floats[2]) +
              local_1d8.m_floats[0] * ((float)local_88._0_4_ - bVar20.m_floats[0]) +
              local_1d8.m_floats[1] * ((float)local_88._4_4_ - bVar20.m_floats[1]) <
              fVar14 * (local_188 - local_128) +
              -fVar15 * (local_168 - (float)local_78._0_4_) +
              -fVar16 * (fStack_164 - (float)local_78._4_4_)) {
            this->m_lastUsedMethod = 10;
            local_1d8.m_floats._0_8_ = local_1d8.m_floats._0_8_ ^ 0x8000000080000000;
            local_1d8.m_floats._8_8_ = local_1d8.m_floats._8_8_ ^ 0x80000000;
          }
        }
        else {
          this->m_lastUsedMethod = 8;
        }
      }
      else {
        this->m_lastUsedMethod = 9;
      }
    }
  }
  if ((bVar9) && ((fVar13 < 0.0 || (fVar13 * fVar13 < input->m_maximumDistanceSquared)))) {
    *(undefined8 *)v->m_floats = local_1d8.m_floats._0_8_;
    *(undefined8 *)((this->m_cachedSeparatingAxis).m_floats + 2) = local_1d8.m_floats._8_8_;
    this->m_cachedSeparatingDistance = fVar13;
    pInA.m_floats[1] = fStack_54 + seperatingAxisInB.m_floats[1];
    pInA.m_floats[0] = local_58 + seperatingAxisInB.m_floats[0];
    pInA.m_floats[2] = (float)local_68._0_4_ + seperatingAxisInB.m_floats[2];
    pInA.m_floats[3] = 0.0;
    (*output->_vptr_Result[4])();
  }
  return;
}

Assistant:

void btGjkPairDetector::getClosestPointsNonVirtual(const ClosestPointInput& input, Result& output, class btIDebugDraw* debugDraw)
#endif
{
	m_cachedSeparatingDistance = 0.f;

	btScalar distance=btScalar(0.);
	btVector3	normalInB(btScalar(0.),btScalar(0.),btScalar(0.));

	btVector3 pointOnA,pointOnB;
	btTransform	localTransA = input.m_transformA;
	btTransform localTransB = input.m_transformB;
	btVector3 positionOffset=(localTransA.getOrigin() + localTransB.getOrigin()) * btScalar(0.5);
	localTransA.getOrigin() -= positionOffset;
	localTransB.getOrigin() -= positionOffset;

	bool check2d = m_minkowskiA->isConvex2d() && m_minkowskiB->isConvex2d();

	btScalar marginA = m_marginA;
	btScalar marginB = m_marginB;

	gNumGjkChecks++;

	//for CCD we don't use margins
	if (m_ignoreMargin)
	{
		marginA = btScalar(0.);
		marginB = btScalar(0.);
	}

	m_curIter = 0;
	int gGjkMaxIter = 1000;//this is to catch invalid input, perhaps check for #NaN?
	m_cachedSeparatingAxis.setValue(0,1,0);

	bool isValid = false;
	bool checkSimplex = false;
	bool checkPenetration = true;
	m_degenerateSimplex = 0;

	m_lastUsedMethod = -1;

	{
		btScalar squaredDistance = BT_LARGE_FLOAT;
		btScalar delta = btScalar(0.);
		
		btScalar margin = marginA + marginB;
		
		

		m_simplexSolver->reset();
		
		for ( ; ; )
		//while (true)
		{

			btVector3 seperatingAxisInA = (-m_cachedSeparatingAxis)* input.m_transformA.getBasis();
			btVector3 seperatingAxisInB = m_cachedSeparatingAxis* input.m_transformB.getBasis();


			btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
			btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

			btVector3  pWorld = localTransA(pInA);	
			btVector3  qWorld = localTransB(qInB);


			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			btVector3 w	= pWorld - qWorld;
			delta = m_cachedSeparatingAxis.dot(w);

			// potential exit, they don't overlap
			if ((delta > btScalar(0.0)) && (delta * delta > squaredDistance * input.m_maximumDistanceSquared)) 
			{
				m_degenerateSimplex = 10;
				checkSimplex=true;
				//checkPenetration = false;
				break;
			}

			//exit 0: the new point is already in the simplex, or we didn't come any closer
			if (m_simplexSolver->inSimplex(w))
			{
				m_degenerateSimplex = 1;
				checkSimplex = true;
				break;
			}
			// are we getting any closer ?
			btScalar f0 = squaredDistance - delta;
			btScalar f1 = squaredDistance * REL_ERROR2;

			if (f0 <= f1)
			{
				if (f0 <= btScalar(0.))
				{
					m_degenerateSimplex = 2;
				} else
				{
					m_degenerateSimplex = 11;
				}
				checkSimplex = true;
				break;
			}

			//add current vertex to simplex
			m_simplexSolver->addVertex(w, pWorld, qWorld);
			btVector3 newCachedSeparatingAxis;

			//calculate the closest point to the origin (update vector v)
			if (!m_simplexSolver->closest(newCachedSeparatingAxis))
			{
				m_degenerateSimplex = 3;
				checkSimplex = true;
				break;
			}

			if(newCachedSeparatingAxis.length2()<REL_ERROR2)
            {
				m_cachedSeparatingAxis = newCachedSeparatingAxis;
                m_degenerateSimplex = 6;
                checkSimplex = true;
                break;
            }

			btScalar previousSquaredDistance = squaredDistance;
			squaredDistance = newCachedSeparatingAxis.length2();
#if 0
///warning: this termination condition leads to some problems in 2d test case see Bullet/Demos/Box2dDemo
			if (squaredDistance>previousSquaredDistance)
			{
				m_degenerateSimplex = 7;
				squaredDistance = previousSquaredDistance;
                checkSimplex = false;
                break;
			}
#endif //
			

			//redundant m_simplexSolver->compute_points(pointOnA, pointOnB);

			//are we getting any closer ?
			if (previousSquaredDistance - squaredDistance <= SIMD_EPSILON * previousSquaredDistance) 
			{ 
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				checkSimplex = true;
				m_degenerateSimplex = 12;
				
				break;
			}

			m_cachedSeparatingAxis = newCachedSeparatingAxis;

			  //degeneracy, this is typically due to invalid/uninitialized worldtransforms for a btCollisionObject   
              if (m_curIter++ > gGjkMaxIter)   
              {   
                      #if defined(DEBUG) || defined (_DEBUG)

                              printf("btGjkPairDetector maxIter exceeded:%i\n",m_curIter);   
                              printf("sepAxis=(%f,%f,%f), squaredDistance = %f, shapeTypeA=%i,shapeTypeB=%i\n",   
                              m_cachedSeparatingAxis.getX(),   
                              m_cachedSeparatingAxis.getY(),   
                              m_cachedSeparatingAxis.getZ(),   
                              squaredDistance,   
                              m_minkowskiA->getShapeType(),   
                              m_minkowskiB->getShapeType());   

                      #endif   
                      break;   

              } 


			bool check = (!m_simplexSolver->fullSimplex());
			//bool check = (!m_simplexSolver->fullSimplex() && squaredDistance > SIMD_EPSILON * m_simplexSolver->maxVertex());

			if (!check)
			{
				//do we need this backup_closest here ?
//				m_simplexSolver->backup_closest(m_cachedSeparatingAxis);
				m_degenerateSimplex = 13;
				break;
			}
		}

		if (checkSimplex)
		{
			m_simplexSolver->compute_points(pointOnA, pointOnB);
			normalInB = m_cachedSeparatingAxis;

			btScalar lenSqr =m_cachedSeparatingAxis.length2();
			
			//valid normal
			if (lenSqr < 0.0001)
			{
				m_degenerateSimplex = 5;
			} 
			if (lenSqr > SIMD_EPSILON*SIMD_EPSILON)
			{
				btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
				normalInB *= rlen; //normalize

				btScalar s = btSqrt(squaredDistance);
			
				btAssert(s > btScalar(0.0));
				pointOnA -= m_cachedSeparatingAxis * (marginA / s);
				pointOnB += m_cachedSeparatingAxis * (marginB / s);
				distance = ((btScalar(1.)/rlen) - margin);
				isValid = true;
				
				m_lastUsedMethod = 1;
			} else
			{
				m_lastUsedMethod = 2;
			}
		}

		bool catchDegeneratePenetrationCase = 
			(m_catchDegeneracies && m_penetrationDepthSolver && m_degenerateSimplex && ((distance+margin) < 0.01));

		//if (checkPenetration && !isValid)
		if (checkPenetration && (!isValid || catchDegeneratePenetrationCase ))
		{
			//penetration case

			//if there is no way to handle penetrations, bail out
			if (m_penetrationDepthSolver)
			{
				// Penetration depth case.
				btVector3 tmpPointOnA,tmpPointOnB;
				
				gNumDeepPenetrationChecks++;
				m_cachedSeparatingAxis.setZero();

				bool isValid2 = m_penetrationDepthSolver->calcPenDepth( 
					*m_simplexSolver, 
					m_minkowskiA,m_minkowskiB,
					localTransA,localTransB,
					m_cachedSeparatingAxis, tmpPointOnA, tmpPointOnB,
					debugDraw
					);


				if (isValid2)
				{
					btVector3 tmpNormalInB = tmpPointOnB-tmpPointOnA;
					btScalar lenSqr = tmpNormalInB.length2();
					if (lenSqr <= (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB = m_cachedSeparatingAxis;
						lenSqr = m_cachedSeparatingAxis.length2();
					}

					if (lenSqr > (SIMD_EPSILON*SIMD_EPSILON))
					{
						tmpNormalInB /= btSqrt(lenSqr);
						btScalar distance2 = -(tmpPointOnA-tmpPointOnB).length();
						m_lastUsedMethod = 3;
						//only replace valid penetrations when the result is deeper (check)
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							normalInB = tmpNormalInB;
							///todo: need to track down this EPA penetration solver degeneracy
							///the penetration solver reports penetration but the contact normal
							///connecting the contact points is pointing in the opposite direction
							///until then, detect the issue and revert the normal
							{
								btScalar d1=0;
								{
									btVector3 seperatingAxisInA = (normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = -normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d1 = (-normalInB).dot(w);
								}
								btScalar d0 = 0.f;
								{
									btVector3 seperatingAxisInA = (-normalInB)* input.m_transformA.getBasis();
									btVector3 seperatingAxisInB = normalInB* input.m_transformB.getBasis();
								

									btVector3 pInA = m_minkowskiA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
									btVector3 qInB = m_minkowskiB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);

									btVector3  pWorld = localTransA(pInA);	
									btVector3  qWorld = localTransB(qInB);
									btVector3 w	= pWorld - qWorld;
									d0 = normalInB.dot(w);
								}
								if (d1>d0)
								{
									m_lastUsedMethod = 10;
									normalInB*=-1;
								} 

							}
							isValid = true;
							
						} else
						{
							m_lastUsedMethod = 8;
						}
					} else
					{
						m_lastUsedMethod = 9;
					}
				} else

				{
					///this is another degenerate case, where the initial GJK calculation reports a degenerate case
					///EPA reports no penetration, and the second GJK (using the supporting vector without margin)
					///reports a valid positive distance. Use the results of the second GJK instead of failing.
					///thanks to Jacob.Langford for the reproduction case
					///http://code.google.com/p/bullet/issues/detail?id=250

				
					if (m_cachedSeparatingAxis.length2() > btScalar(0.))
					{
						btScalar distance2 = (tmpPointOnA-tmpPointOnB).length()-margin;
						//only replace valid distances when the distance is less
						if (!isValid || (distance2 < distance))
						{
							distance = distance2;
							pointOnA = tmpPointOnA;
							pointOnB = tmpPointOnB;
							pointOnA -= m_cachedSeparatingAxis * marginA ;
							pointOnB += m_cachedSeparatingAxis * marginB ;
							normalInB = m_cachedSeparatingAxis;
							normalInB.normalize();

							isValid = true;
							m_lastUsedMethod = 6;
						} else
						{
							m_lastUsedMethod = 5;
						}
					}
				}
				
			}

		}
	}

	

	if (isValid && ((distance < 0) || (distance*distance < input.m_maximumDistanceSquared)))
	{

		m_cachedSeparatingAxis = normalInB;
		m_cachedSeparatingDistance = distance;

		output.addContactPoint(
			normalInB,
			pointOnB+positionOffset,
			distance);

	}


}